

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression.c
# Opt level: O0

void confint(reg_object obj)

{
  uint local_14;
  int i;
  reg_object obj_local;
  
  printf("\n");
  printf("%-10lf%% Confidence Interval For Parameters And Residual Variance : \n",
         (1.0 - obj->alpha) * 100.0);
  printf("%-25s%-20s%-20s%-20s \n","Parameters","Value","Lower Limit","Upper Limit");
  for (local_14 = 0; (int)local_14 < obj->p; local_14 = local_14 + 1) {
    printf("B%-25d%-20lf%-20lf%-20lf \n",obj->beta[(int)local_14].value,
           obj->beta[(int)local_14].lower,obj->beta[(int)local_14].upper,(ulong)local_14);
  }
  printf("%-25s%-20lf%-20lf%-20lf \n",obj->sigma,obj->sigma_lower,obj->sigma_upper,
         "Residual Variance");
  return;
}

Assistant:

void confint(reg_object obj) {
	int i;
	printf("\n");
	printf("%-10lf%% Confidence Interval For Parameters And Residual Variance : \n", (1.0 - obj->alpha) * 100);
	printf("%-25s%-20s%-20s%-20s \n", "Parameters",
		"Value", "Lower Limit", "Upper Limit");

	for (i = 0; i < obj->p; ++i) {
		printf("B%-25d%-20lf%-20lf%-20lf \n",
			i, (obj->beta + i)->value, (obj->beta + i)->lower, (obj->beta + i)->upper);
	}
	printf("%-25s%-20lf%-20lf%-20lf \n", "Residual Variance",
		obj->sigma, obj->sigma_lower, obj->sigma_upper);
}